

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

void cmakemainMessageCallback(char *m,char *param_2,bool *param_3,void *clientdata)

{
  ostream *poVar1;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,m);
  cmakemainGetStack_abi_cxx11_(&sStack_38,clientdata);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

static void cmakemainMessageCallback(const char* m, const char* /*unused*/,
                                     bool& /*unused*/, void* clientdata)
{
  std::cerr << m << cmakemainGetStack(clientdata) << std::endl << std::flush;
}